

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeakForAllocationStage
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,uchar allocation_stage)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar1;
  ulong uVar2;
  
  for (pMVar1 = *(MemoryLeakDetectorNode **)(leak + 0x38);
      (pMVar1 != (MemoryLeakDetectorNode *)0x0 &&
      (pMVar1[0x34] != (MemoryLeakDetectorNode)allocation_stage));
      pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38)) {
  }
  if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
    uVar2 = *(ulong *)(leak + 0x10) % 0x49;
    do {
      if (0x47 < uVar2) {
        return (MemoryLeakDetectorNode *)0x0;
      }
      for (pMVar1 = this->table_[uVar2 + 1].head_;
          (pMVar1 != (MemoryLeakDetectorNode *)0x0 &&
          (pMVar1[0x34] != (MemoryLeakDetectorNode)allocation_stage));
          pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38)) {
      }
      uVar2 = uVar2 + 1;
    } while (pMVar1 == (MemoryLeakDetectorNode *)0x0);
  }
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeakForAllocationStage(MemoryLeakDetectorNode* leak, unsigned char allocation_stage)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeakForAllocationStage(leak, allocation_stage);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}